

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::DiscreteSpectrum
          (DiscreteSpectrum *this,double chain,array<double,_2UL> *energy,
          array<double,_2UL> *intensity,double type,array<double,_2UL> *ris,array<double,_2UL> *ricc
          ,array<double,_2UL> *rick,array<double,_2UL> *ricl)

{
  double dVar1;
  double dVar2;
  _Vector_base<double,_std::allocator<double>_> local_78;
  undefined1 local_60 [48];
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  dVar1 = energy->_M_elems[0];
  dVar2 = energy->_M_elems[1];
  generateList((vector<double,_std::allocator<double>_> *)&local_78,chain,type,intensity,ris,ricc,
               rick,ricl);
  local_60._8_8_ =
       (long)local_78._M_impl.super__Vector_impl_data._M_finish -
       (long)local_78._M_impl.super__Vector_impl_data._M_start >> 3;
  local_60._0_8_ = 0;
  local_60._16_8_ = 0;
  local_60._24_8_ = 0;
  local_60._40_4_ = SUB84(dVar1,0);
  local_60._32_8_ = dVar2;
  local_60._44_4_ = (int)((ulong)dVar1 >> 0x20);
  local_30._M_impl.super__Vector_impl_data._M_start =
       local_78._M_impl.super__Vector_impl_data._M_start;
  local_30._M_impl.super__Vector_impl_data._M_finish =
       local_78._M_impl.super__Vector_impl_data._M_finish;
  local_30._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DiscreteSpectrum(this,(ListRecord *)local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

DiscreteSpectrum( double chain,
                  const std::array< double, 2 >& energy,
                  const std::array< double, 2 >& intensity,
                  double type,
                  const std::array< double, 2 >& ris,
                  const std::array< double, 2 >& ricc,
                  const std::array< double, 2 >& rick,
                  const std::array< double, 2 >& ricl ) :
  // this can never fail, try-catch would be unreachable
  DiscreteSpectrum(
        ListRecord( energy[0], energy[1], 0, 0, 0,
                    generateList( chain, type,
                                  intensity,
                                  ris, ricc, rick, ricl ) ) ) {}